

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<int&,int&>
          (QPodArrayOps<std::pair<int,int>> *this,qsizetype i,int *args,int *args_1)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  pair<int,_int> *ppVar7;
  GrowthPosition where;
  pair<int,_int> pVar8;
  
  piVar3 = *(int **)this;
  if ((piVar3 != (int *)0x0) && (*piVar3 < 2)) {
    lVar4 = *(long *)(this + 0x10);
    if ((lVar4 == i) &&
       (lVar5 = *(long *)(this + 8),
       *(long *)(piVar3 + 2) !=
       ((long)(lVar5 - ((long)piVar3 + 0x1fU & 0xfffffffffffffff0)) >> 3) + i)) {
      *(int *)(lVar5 + i * 8) = *args;
      *(int *)(lVar5 + 4 + i * 8) = *args_1;
      *(qsizetype *)(this + 0x10) = i + 1;
      return;
    }
    if ((i == 0) &&
       (uVar6 = *(ulong *)(this + 8), ((long)piVar3 + 0x1fU & 0xfffffffffffffff0) != uVar6)) {
      *(int *)(uVar6 - 8) = *args;
      *(int *)(uVar6 - 4) = *args_1;
      *(ulong *)(this + 8) = uVar6 - 8;
      *(long *)(this + 0x10) = lVar4 + 1;
      return;
    }
  }
  iVar1 = *args;
  iVar2 = *args_1;
  where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
  QArrayDataPointer<std::pair<int,_int>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<int,_int>_> *)this,where,1,(pair<int,_int> **)0x0,
             (QArrayDataPointer<std::pair<int,_int>_> *)0x0);
  ppVar7 = QPodArrayOps<std::pair<int,_int>_>::createHole
                     ((QPodArrayOps<std::pair<int,_int>_> *)this,where,i,1);
  pVar8.second = iVar2;
  pVar8.first = iVar1;
  *ppVar7 = pVar8;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }